

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O0

QueryResult * __thiscall
OnDiskDataset::query(OnDiskDataset *this,Query *query,QueryCounters *counters)

{
  QueryResult *in_RDI;
  set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_> seen;
  anon_class_16_2_3fe5b836 *__f;
  QueryResult *this_00;
  anon_class_16_2_3fe5b836 local_50 [5];
  
  __f = local_50;
  this_00 = in_RDI;
  std::set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>::set
            ((set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_> *)
             0x1a2c52);
  std::function<QueryResult(PrimitiveQuery,QueryCounters*)>::
  function<OnDiskDataset::query(Query_const&,QueryCounters*)const::__0,void>
            ((function<QueryResult_(PrimitiveQuery,_QueryCounters_*)> *)this_00,__f);
  std::function<void(PrimitiveQuery)>::
  function<OnDiskDataset::query(Query_const&,QueryCounters*)const::__1,void>
            ((function<void_(PrimitiveQuery)> *)this_00,__f);
  Query::run((Query *)this,(QueryPrimitive *)query,(PrefetchFunc *)counters,
             (QueryCounters *)seen._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::function<void_(PrimitiveQuery)>::~function((function<void_(PrimitiveQuery)> *)0x1a2ce2);
  std::function<QueryResult_(PrimitiveQuery,_QueryCounters_*)>::~function
            ((function<QueryResult_(PrimitiveQuery,_QueryCounters_*)> *)0x1a2cef);
  std::set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>::~set
            ((set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_> *)
             0x1a2cfc);
  return in_RDI;
}

Assistant:

QueryResult OnDiskDataset::query(const Query &query,
                                 QueryCounters *counters) const {
    std::set<PrimitiveQuery> seen;
    return query.run(
        [this, &seen](PrimitiveQuery primitive, QueryCounters *counters) {
            std::optional<QueryOperation> operation;
            if (seen.count(primitive) == 0) {
                operation = std::make_optional(&counters->uniq_reads());
                seen.insert(primitive);
            }
            for (auto &ndx : indices) {
                if (ndx.index_type() == primitive.itype) {
                    return ndx.query(primitive.trigram, counters);
                }
            }
            throw std::runtime_error("Unexpected ngram type in query");
        },
        [this, &seen](PrimitiveQuery primitive) {
            for (auto &ndx : indices) {
                if (ndx.index_type() == primitive.itype) {
                    ndx.prefetch(primitive.trigram);
                }
            }
        },
        counters);
}